

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  stbi__jpeg *in_RDI;
  uint k;
  uint local_4;
  
  if (in_RDI->code_bits < 1) {
    stbi__grow_buffer_unsafe(in_RDI);
  }
  if (in_RDI->code_bits < 1) {
    local_4 = 0;
  }
  else {
    local_4 = in_RDI->code_buffer;
    in_RDI->code_buffer = in_RDI->code_buffer << 1;
    in_RDI->code_bits = in_RDI->code_bits + -1;
    local_4 = local_4 & 0x80000000;
  }
  return local_4;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
   unsigned int k;
   if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < 1) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = j->code_buffer;
   j->code_buffer <<= 1;
   --j->code_bits;
   return k & 0x80000000;
}